

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

bool vkt::pipeline::anon_unknown_0::StorageImage::compareImages
               (TestLog *log,CaseDef *caseDef,ConstPixelBufferAccess *layeredReferenceImage,
               ConstPixelBufferAccess *layeredActualImage)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  bool local_8f1;
  int local_8c4;
  bool local_8a9;
  MessageBuilder local_8a8;
  MessageBuilder local_728;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  LogImage local_558;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  LogImage local_478;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  LogImage local_398;
  LogImageSet local_308;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  LogImage local_278;
  LogImageSet local_1e8;
  undefined1 local_1a4 [16];
  undefined1 local_194 [16];
  undefined1 local_184 [16];
  undefined1 local_174 [24];
  int x;
  int y;
  int numBadPixels;
  PixelBufferAccess errorMask;
  undefined1 local_128 [8];
  TextureLevel errorMaskStorage;
  string local_f0;
  undefined1 local_d0 [8];
  string imageName;
  ConstPixelBufferAccess actualImage;
  ConstPixelBufferAccess referenceImage;
  int layerNdx;
  int goodLayers;
  int badPixelTolerance;
  bool isAnyIntFormat;
  Vec4 badColor;
  Vec4 goodColor;
  ConstPixelBufferAccess *layeredActualImage_local;
  ConstPixelBufferAccess *layeredReferenceImage_local;
  CaseDef *caseDef_local;
  TestLog *log_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(badColor.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&badPixelTolerance,1.0,0.0,0.0,1.0);
  bVar2 = ::vk::isIntFormat(caseDef->colorFormat);
  local_8a9 = true;
  if (!bVar2) {
    local_8a9 = ::vk::isUintFormat(caseDef->colorFormat);
  }
  if (local_8a9 == false) {
    local_8c4 = 0;
  }
  else {
    local_8c4 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
    local_8c4 = local_8c4 << 1;
  }
  referenceImage.m_data._4_4_ = 0;
  for (referenceImage.m_data._0_4_ = 0; iVar5 = (int)referenceImage.m_data,
      (int)referenceImage.m_data < caseDef->numLayers;
      referenceImage.m_data._0_4_ = (int)referenceImage.m_data + 1) {
    iVar3 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
    iVar4 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
    tcu::getSubregion((ConstPixelBufferAccess *)&actualImage.m_data,layeredReferenceImage,0,0,iVar5,
                      iVar3,iVar4,1);
    iVar5 = (int)referenceImage.m_data;
    iVar3 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
    iVar4 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
    tcu::getSubregion((ConstPixelBufferAccess *)((long)&imageName.field_2 + 8),layeredActualImage,0,
                      0,iVar5,iVar3,iVar4,1);
    de::toString<int>(&local_f0,(int *)&referenceImage.m_data);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   "color layer ",&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    tcu::TextureFormat::TextureFormat
              ((TextureFormat *)&errorMask.super_ConstPixelBufferAccess.m_data,RGB,UNORM_INT8);
    iVar5 = tcu::Vector<int,_2>::x(&caseDef->renderSize);
    iVar3 = tcu::Vector<int,_2>::y(&caseDef->renderSize);
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)local_128,
               (TextureFormat *)&errorMask.super_ConstPixelBufferAccess.m_data,iVar5,iVar3,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&y,(TextureLevel *)local_128);
    x = 0;
    for (local_174._20_4_ = 0; uVar1 = local_174._20_4_,
        iVar5 = tcu::Vector<int,_2>::y(&caseDef->renderSize), (int)uVar1 < iVar5;
        local_174._20_4_ = local_174._20_4_ + 1) {
      for (local_174._16_4_ = 0; uVar1 = local_174._16_4_,
          iVar5 = tcu::Vector<int,_2>::x(&caseDef->renderSize), (int)uVar1 < iVar5;
          local_174._16_4_ = local_174._16_4_ + 1) {
        local_8f1 = false;
        if (local_8a9 != false) {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_174,(int)&actualImage + 0x20,local_174._16_4_,
                     local_174._20_4_);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_184,(int)&imageName + 0x18,local_174._16_4_,
                     local_174._20_4_);
          local_8f1 = tcu::Vector<int,_4>::operator==
                                ((Vector<int,_4> *)local_174,(Vector<int,_4> *)local_184);
        }
        if (local_8f1 == false) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_194,(int)&actualImage + 0x20,local_174._16_4_,
                     local_174._20_4_);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1a4,(int)&imageName + 0x18,local_174._16_4_,
                     local_174._20_4_);
          bVar2 = tcu::Vector<float,_4>::operator==
                            ((Vector<float,_4> *)local_194,(Vector<float,_4> *)local_1a4);
          if (bVar2) {
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&y,(Vec4 *)(badColor.m_data + 2),local_174._16_4_,
                       local_174._20_4_,0);
          }
          else {
            x = x + 1;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&y,(Vec4 *)&badPixelTolerance,local_174._16_4_,
                       local_174._20_4_,0);
          }
        }
        else {
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&y,(Vec4 *)(badColor.m_data + 2),local_174._16_4_,
                     local_174._20_4_,0);
        }
      }
    }
    if (local_8c4 < x) {
      tcu::LogImageSet::LogImageSet(&local_308,(string *)local_d0,(string *)local_d0);
      pTVar6 = tcu::TestLog::operator<<(log,&local_308);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"Result",&local_3b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"Result",&local_3e1);
      tcu::LogImage::LogImage
                (&local_398,&local_3b8,&local_3e0,
                 (ConstPixelBufferAccess *)((long)&imageName.field_2 + 8),
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_398);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_498,"Reference",&local_499);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"Reference",&local_4c1);
      tcu::LogImage::LogImage
                (&local_478,&local_498,&local_4c0,(ConstPixelBufferAccess *)&actualImage.m_data,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_478);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_578,"ErrorMask",&local_579);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a0,"Error mask",&local_5a1);
      tcu::LogImage::LogImage
                (&local_558,&local_578,&local_5a0,(ConstPixelBufferAccess *)&y,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_558);
      tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_558);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::allocator<char>::~allocator(&local_5a1);
      std::__cxx11::string::~string((string *)&local_578);
      std::allocator<char>::~allocator(&local_579);
      tcu::LogImage::~LogImage(&local_478);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator(&local_499);
      tcu::LogImage::~LogImage(&local_398);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator(&local_3e1);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      tcu::LogImageSet::~LogImageSet(&local_308);
    }
    else {
      referenceImage.m_data._4_4_ = referenceImage.m_data._4_4_ + 1;
      tcu::LogImageSet::LogImageSet(&local_1e8,(string *)local_d0,(string *)local_d0);
      pTVar6 = tcu::TestLog::operator<<(log,&local_1e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"Result",&local_299);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Result",&local_2c1);
      tcu::LogImage::LogImage
                (&local_278,&local_298,&local_2c0,
                 (ConstPixelBufferAccess *)((long)&imageName.field_2 + 8),
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_278);
      tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_278);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator(&local_299);
      tcu::LogImageSet::~LogImageSet(&local_1e8);
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_128);
    std::__cxx11::string::~string((string *)local_d0);
  }
  bVar2 = referenceImage.m_data._4_4_ != caseDef->numLayers;
  if (bVar2) {
    tcu::TestLog::operator<<(&local_8a8,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_8a8,(char (*) [45])"FAILED: Some rendered images were incorrect.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_8a8);
  }
  else {
    tcu::TestLog::operator<<(&local_728,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_728,(char (*) [33])"All rendered images are correct.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_728);
  }
  log_local._7_1_ = !bVar2;
  return log_local._7_1_;
}

Assistant:

bool compareImages (tcu::TestLog& log, const CaseDef& caseDef, const tcu::ConstPixelBufferAccess layeredReferenceImage, const tcu::ConstPixelBufferAccess layeredActualImage)
{
	DE_ASSERT(caseDef.numSamples > 1);

	const Vec4	goodColor			= Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const Vec4	badColor			= Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const bool	isAnyIntFormat		= isIntFormat(caseDef.colorFormat) || isUintFormat(caseDef.colorFormat);

	// There should be no mismatched pixels for non-integer formats. Otherwise we may get a wrong color in a location where sample coverage isn't exactly 0 or 1.
	const int	badPixelTolerance	= (isAnyIntFormat ? 2 * caseDef.renderSize.x() : 0);
	int			goodLayers			= 0;

	for (int layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
	{
		const tcu::ConstPixelBufferAccess	referenceImage	= tcu::getSubregion(layeredReferenceImage, 0, 0, layerNdx, caseDef.renderSize.x(), caseDef.renderSize.y(), 1);
		const tcu::ConstPixelBufferAccess	actualImage		= tcu::getSubregion(layeredActualImage, 0, 0, layerNdx, caseDef.renderSize.x(), caseDef.renderSize.y(), 1);
		const std::string					imageName		= "color layer " + de::toString(layerNdx);

		tcu::TextureLevel		errorMaskStorage	(tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), caseDef.renderSize.x(), caseDef.renderSize.y());
		tcu::PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
		int						numBadPixels		= 0;

		for (int y = 0; y < caseDef.renderSize.y(); ++y)
		for (int x = 0; x < caseDef.renderSize.x(); ++x)
		{
			if (isAnyIntFormat && (referenceImage.getPixelInt(x, y) == actualImage.getPixelInt(x, y)))
				errorMask.setPixel(goodColor, x, y);
			else if (referenceImage.getPixel(x, y) == actualImage.getPixel(x, y))
				errorMask.setPixel(goodColor, x, y);
			else
			{
				++numBadPixels;
				errorMask.setPixel(badColor, x, y);
			}
		}

		if (numBadPixels <= badPixelTolerance)
		{
			++goodLayers;

			log << tcu::TestLog::ImageSet(imageName, imageName)
				<< tcu::TestLog::Image("Result",	"Result",		actualImage)
				<< tcu::TestLog::EndImageSet;
		}
		else
		{
			log << tcu::TestLog::ImageSet(imageName, imageName)
				<< tcu::TestLog::Image("Result",	"Result",		actualImage)
				<< tcu::TestLog::Image("Reference",	"Reference",	referenceImage)
				<< tcu::TestLog::Image("ErrorMask",	"Error mask",	errorMask)
				<< tcu::TestLog::EndImageSet;
		}
	}

	if (goodLayers == caseDef.numLayers)
	{
		log << tcu::TestLog::Message << "All rendered images are correct." << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << "FAILED: Some rendered images were incorrect." << tcu::TestLog::EndMessage;
		return false;
	}
}